

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O0

index_t __thiscall xLearn::OndiskReader::Samples(OndiskReader *this,DMatrix **matrix)

{
  Reader *block;
  Reader *this_00;
  long *in_RSI;
  size_t *in_RDI;
  size_t ret;
  uint64 read_byte;
  size_t in_stack_00000248;
  char *in_stack_00000250;
  FILE *in_stack_00000258;
  FILE *in_stack_ffffffffffffffc8;
  index_t local_4;
  
  this_00 = (Reader *)(in_RDI[0x19] << 0x14);
  block = (Reader *)ReadDataFromDisk(in_stack_00000258,in_stack_00000250,in_stack_00000248);
  if (block == (Reader *)0x0) {
    *in_RSI = 0;
    local_4 = 0;
  }
  else {
    if (block == this_00) {
      Reader::shrink_block(this_00,(char *)block,in_RDI,in_stack_ffffffffffffffc8);
    }
    (**(code **)(*(long *)in_RDI[0x12] + 0x10))
              ((long *)in_RDI[0x12],in_RDI[0x18],block,in_RDI + 5,1);
    *in_RSI = (long)(in_RDI + 5);
    local_4 = (index_t)in_RDI[7];
  }
  return local_4;
}

Assistant:

index_t OndiskReader::Samples(DMatrix* &matrix) {
  // Convert MB to Byte
  uint64 read_byte = block_size_ * 1024 * 1024;
  // Read a block of data from disk file
  size_t ret = ReadDataFromDisk(file_ptr_, block_, read_byte);
  if (ret == 0) {
    matrix = nullptr;
    return 0;
  } else if (ret == read_byte) {
    // Find the last '\n', and shrink back file pointer
    shrink_block(block_, &ret, file_ptr_);
  } // else ret < read_byte: we don't need shrink_block()
  // Parse block to data_sample_
  parser_->Parse(block_, ret, data_samples_, true);
  matrix = &data_samples_;
  return data_samples_.row_length;
}